

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QWindowSystemInterface::TouchPoint>::clear(QList<QWindowSystemInterface::TouchPoint> *this)

{
  long lVar1;
  Data *pDVar2;
  TouchPoint *pTVar3;
  longlong lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_38;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    pDVar2 = (this->d).d;
    if (pDVar2 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        pTVar3 = (this->d).ptr;
        std::_Destroy_aux<false>::__destroy<QWindowSystemInterface::TouchPoint*>
                  (pTVar3,pTVar3 + lVar1);
        (this->d).size = 0;
        goto LAB_0012a0d6;
      }
      lVar4 = (pDVar2->super_QArrayData).alloc;
    }
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (TouchPoint *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pTVar3 = (TouchPoint *)QArrayData::allocate(&local_20,0x78,0x10,lVar4,KeepSize);
    local_38.d = (this->d).d;
    (this->d).d = (Data *)local_20;
    local_38.ptr = (this->d).ptr;
    (this->d).ptr = pTVar3;
    local_38.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::~QArrayDataPointer(&local_38);
  }
LAB_0012a0d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }